

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_server.c
# Opt level: O3

int start_game(void)

{
  int iVar1;
  __pid_t _Var2;
  PIPE *pipes_00;
  ssize_t sVar3;
  char *__s;
  long lVar4;
  int game_pipe [2];
  PIPE pipes [20];
  int local_22a0;
  int local_229c;
  char local_2298 [4096];
  int local_1298 [2];
  undefined2 local_1290 [10];
  undefined8 local_127c [5];
  undefined8 auStack_124e [581];
  
  puts("Start game server...");
  lVar4 = 0;
  do {
    pipe((int *)((long)local_1298 + lVar4));
    *(undefined2 *)((long)local_1290 + lVar4) = 0;
    *(undefined8 *)((long)local_127c + lVar4) = 0;
    *(undefined8 *)((long)local_127c + lVar4 + 8) = 0;
    *(undefined8 *)((long)local_127c + lVar4 + 0x10) = 0;
    *(undefined8 *)((long)local_127c + lVar4 + 0x18) = 0;
    *(undefined8 *)((long)local_127c + lVar4 + 0x20) = 0;
    *(undefined8 *)(&stack0xffffffffffffedac + lVar4) = 0;
    *(undefined8 *)((long)auStack_124e + lVar4) = 0;
    lVar4 = lVar4 + 0xec;
  } while (lVar4 != 0x1270);
  iVar1 = shmget(0,0x1270,0x7a0);
  if (iVar1 == -1) {
    __s = "Sharing memory cannot been created!";
  }
  else {
    pipes_00 = (PIPE *)shmat(iVar1,(void *)0x0,0);
    if (pipes_00 == (PIPE *)0xffffffffffffffff) {
      __s = "Cannot link sharing memory to this process!(Game server)";
    }
    else {
      memcpy(pipes_00,local_1298,0x1270);
      pipe(&local_22a0);
      _Var2 = fork();
      if (_Var2 == 0) {
        iVar1 = start_websocket(0x2382,iVar1,local_229c);
        if (iVar1 == -1) {
          __s = "Websocket server start failure!";
          goto LAB_00103fa6;
        }
      }
      memset(local_2298,0,0x1000);
      sVar3 = read(local_22a0,local_2298,0x1000);
      if (0 < sVar3) {
        do {
          iVar1 = deal_info(local_2298,pipes_00);
          if (iVar1 == -1) {
            printf("The info:%s is illegal!\n");
          }
          memset(local_2298,0,0x1000);
          sVar3 = read(local_22a0,local_2298,0x1000);
        } while (0 < sVar3);
      }
      __s = "Pipe between webSocket and Game server is broken!";
    }
  }
LAB_00103fa6:
  puts(__s);
  return -1;
}

Assistant:

int start_game(){
    printf("Start game server...\n");
    int game_infor[64];

    struct PIPE pipes[MAX_USER];
    for(int i = 0; i < MAX_USER; i++){
        //pipes[i]= (struct PIPE *)malloc(sizeof(struct PIPE));
        pipe(pipes[i].pipe);
        pipes[i].useState = false;
        pipes[i].level = 0;
        memset(pipes[i].score, 0 ,MAX_SONG);
        strcpy(pipes[i].name, "");
    }

    int shm_id;
    struct PIPE *shared = NULL;
    if((shm_id = shmget(IPC_PRIVATE, sizeof(struct PIPE) * MAX_USER, 0640 | IPC_CREAT | IPC_EXCL)) == -1){
        printf("Sharing memory cannot been created!\n");
        return -1;
    }
    shared = (struct PIPE *)shmat(shm_id, NULL, 0);
    if(shared == (struct PIPE *)-1){
        printf("Cannot link sharing memory to this process!(Game server)\n");
        return -1;
    }
    if(memcpy(shared, pipes,sizeof(struct PIPE) * MAX_USER) == NULL){
        printf("Cannot set sharing memory data!\n");
        return -1;
    }

    int game_pipe[2];
    pipe(game_pipe);

    int websocket_fd = 0;

//    if(init_info(game_infor) == -1){
//        printf("Game infor inti failure!\n");
//        return -1;
//    }
    if((websocket_fd = fork()) == 0){
        if(start_websocket(WEBSOCKET_PORT, shm_id, game_pipe[1]) == -1){
            printf("Websocket server start failure!\n");
            return -1;
        }
    }

    while(true){
        char msg[MSG_MAX_SIZE];
        memset(msg, 0, MSG_MAX_SIZE);
        if(read(game_pipe[0], msg, MSG_MAX_SIZE) <= 0){
            printf("Pipe between webSocket and Game server is broken!\n");
            return -1;
        }
        if(deal_info(msg, shared) == -1){
            printf("The info:%s is illegal!\n", msg);
            continue;
        }
    }
}